

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O3

bool __thiscall TcpServer::start(TcpServer *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  undefined1 local_30 [8];
  epoll_event event;
  int reuse;
  
  if (this->readyForStart != true) {
    return false;
  }
  bVar1 = ignoreSignal(this);
  if (!bVar1) {
    return false;
  }
  event.data.fd = 1;
  iVar2 = socket(2,1,6);
  this->serverFd = iVar2;
  if (iVar2 == -1) {
    iVar2 = 0xa6;
LAB_00104414:
    recordError(this,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                ,iVar2);
    return false;
  }
  iVar2 = setsockopt(iVar2,1,2,&event.data,4);
  if (iVar2 < 0) {
    iVar2 = 0xab;
    goto LAB_00104414;
  }
  bVar1 = setNoBlock(this,this->serverFd);
  if (!bVar1) {
    return false;
  }
  iVar2 = bind(this->serverFd,(sockaddr *)this,0x10);
  if (iVar2 < 0) {
    iVar2 = 0xb3;
    goto LAB_00104414;
  }
  iVar2 = listen(this->serverFd,0x400);
  if (iVar2 < 0) {
    iVar2 = 0xb7;
    goto LAB_00104414;
  }
  iVar2 = epoll_create1(0);
  this->epollFd = iVar2;
  if (iVar2 == -1) {
    recordError(this,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                ,0xbb);
    iVar2 = this->serverFd;
    goto LAB_001044aa;
  }
  piVar3 = &this->epollFd;
  local_30._0_4_ = 1;
  local_30._4_4_ = this->serverFd;
  iVar2 = epoll_ctl(iVar2,1,local_30._4_4_,(epoll_event *)local_30);
  if (iVar2 == -1) {
    iVar2 = 0xc3;
LAB_0010445f:
    recordError(this,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                ,iVar2);
    iVar2 = this->serverFd;
LAB_00104467:
    close(iVar2);
  }
  else {
    iVar2 = pipe(this->pipeFds);
    if (iVar2 == -1) {
      iVar2 = 0xc9;
      goto LAB_0010445f;
    }
    bVar1 = setNoBlock(this,this->pipeFds[0]);
    if (bVar1) {
      bVar1 = setNoBlock(this,this->pipeFds[1]);
      if (bVar1) {
        local_30._4_4_ = this->pipeFds[0];
        iVar2 = epoll_ctl(*piVar3,1,local_30._4_4_,(epoll_event *)local_30);
        if (iVar2 != -1) {
          return true;
        }
        iVar2 = 0xe0;
        goto LAB_0010445f;
      }
      piVar3 = this->pipeFds + 1;
      recordError(this,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0xd7);
      close(this->serverFd);
      close(this->epollFd);
      iVar2 = this->pipeFds[0];
      goto LAB_00104467;
    }
    recordError(this,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                ,0xcf);
    close(this->serverFd);
    close(this->epollFd);
    close(this->pipeFds[0]);
    piVar3 = this->pipeFds + 1;
  }
  iVar2 = *piVar3;
LAB_001044aa:
  close(iVar2);
  return false;
}

Assistant:

bool start() {
    if (!readyForStart) {
      return false;
    }
    if (!ignoreSignal()) {  // 忽略SIG_PIPE
      return false;
    }
    int reuse = 1;
    if ((serverFd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP)) == -1) {
      recordError(__FILE__, __LINE__);
      return false;
    }
    if (setsockopt(serverFd, SOL_SOCKET, SO_REUSEADDR, &reuse, sizeof(int)) <
        0) {
      recordError(__FILE__, __LINE__);
      return false;
    }
    if (!setNoBlock(serverFd)) {
      return false;
    }
    if (bind(serverFd, reinterpret_cast<sockaddr *>(&address),
             sizeof(address)) < 0) { /* bind socket fd to address addr */
      recordError(__FILE__, __LINE__);
      return false;
    }
    if (listen(serverFd, 1024) < 0) {
      recordError(__FILE__, __LINE__);
      return false;
    }
    if ((epollFd = epoll_create1(0)) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      return false;
    }
    struct epoll_event event;
    event.events = EPOLLIN;
    event.data.fd = serverFd;
    if (epoll_ctl(epollFd, EPOLL_CTL_ADD, serverFd, &event) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      return false;
    }
    if (pipe(pipeFds) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      return false;
    }
    if (!setNoBlock(pipeFds[0])) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      close(pipeFds[0]);
      close(pipeFds[1]);
      return false;
    }
    if (!setNoBlock(pipeFds[1])) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      close(pipeFds[0]);
      close(pipeFds[1]);
      return false;
    }
    event.data.fd = pipeFds[0];
    if (epoll_ctl(epollFd, EPOLL_CTL_ADD, pipeFds[0], &event) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      return false;
    }
    return true;
  }